

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O0

WatchID __thiscall
efsw::FileWatcher::addWatch
          (FileWatcher *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  bool bVar1;
  int iVar2;
  Error EVar3;
  undefined4 extraout_var;
  string local_58 [32];
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *local_38;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options_local;
  FileWatchListener *pFStack_28;
  bool recursive_local;
  FileWatchListener *watcher_local;
  string *directory_local;
  FileWatcher *this_local;
  
  local_38 = options;
  options_local._7_1_ = recursive;
  pFStack_28 = watcher;
  watcher_local = (FileWatchListener *)directory;
  directory_local = (string *)this;
  if (((this->mImpl->mIsGeneric & 1U) == 0) && (bVar1 = FileSystem::isRemoteFS(directory), bVar1)) {
    std::__cxx11::string::string(local_58,(string *)watcher_local);
    EVar3 = Errors::Log::createLastError(FileRemote,(string *)local_58);
    this_local = (FileWatcher *)(long)EVar3;
    std::__cxx11::string::~string(local_58);
    return (WatchID)this_local;
  }
  iVar2 = (*this->mImpl->_vptr_FileWatcherImpl[2])
                    (this->mImpl,watcher_local,pFStack_28,(ulong)(options_local._7_1_ & 1),local_38)
  ;
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

WatchID FileWatcher::addWatch( const std::string& directory, FileWatchListener* watcher,
							   bool recursive, const std::vector<WatcherOption>& options ) {
	if ( mImpl->mIsGeneric || !FileSystem::isRemoteFS( directory ) ) {
		return mImpl->addWatch( directory, watcher, recursive, options );
	} else {
		return Errors::Log::createLastError( Errors::FileRemote, directory );
	}
}